

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2icrs.cpp
# Opt level: O0

void PrintResults(CESkyCoord *input,CESkyCoord *output,double jd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long *plVar5;
  reference pvVar6;
  long *in_RSI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  CEDate *pCVar7;
  undefined8 uVar8;
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> output_hms;
  vector<double,_std::allocator<double>_> input_hms;
  CEDate local_238 [64];
  CEAngle local_1f8 [16];
  CEDate local_1e8 [64];
  CEAngle local_1a8 [16];
  CEDate local_198 [64];
  CEAngle local_158 [16];
  CEDate local_148 [64];
  CEAngle local_108 [16];
  CEDate local_f8 [64];
  CEAngle local_b8 [16];
  vector<double,_std::allocator<double>_> local_a8 [40];
  CEDate local_80 [64];
  CEAngle local_40 [16];
  vector<double,_std::allocator<double>_> local_30 [24];
  undefined8 local_18;
  long *local_10;
  long *local_8;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  local_8 = in_RDI;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(local_80,0);
  (**(code **)(*in_RDI + 0x18))(local_40,in_RDI,local_80);
  CEAngle::HmsVect();
  CEAngle::~CEAngle(local_40);
  CEDate::~CEDate(local_80);
  plVar5 = local_10;
  pCVar7 = (CEDate *)CppEphem::julian_date_J2000();
  CEDate::CEDate(pCVar7,local_f8,0);
  (**(code **)(*plVar5 + 0x18))(local_b8,plVar5,local_f8);
  CEAngle::HmsVect();
  CEAngle::~CEAngle(local_b8);
  CEDate::~CEDate(local_f8);
  printf("\n");
  printf("**********************************************\n");
  printf("* Results of CIRS -> ICRS                    *\n");
  printf("**********************************************\n");
  printf("ICRS Coordinates (output)\n");
  printf("    Julian Date    : %f\n",local_18);
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_a8,0);
  dVar1 = *pvVar6;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_a8,1);
  dVar2 = *pvVar6;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_a8,2);
  dVar3 = *pvVar6;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_a8,3);
  plVar5 = local_10;
  dVar4 = *pvVar6;
  pCVar7 = (CEDate *)CppEphem::julian_date_J2000();
  CEDate::CEDate(pCVar7,local_148,0);
  (**(code **)(*plVar5 + 0x18))(local_108,plVar5,local_148);
  uVar8 = CEAngle::Deg();
  printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",dVar3 + dVar4,uVar8,
         (ulong)(uint)(int)dVar1,(ulong)(uint)(int)dVar2);
  CEAngle::~CEAngle(local_108);
  CEDate::~CEDate(local_148);
  pCVar7 = (CEDate *)CppEphem::julian_date_J2000();
  CEDate::CEDate(pCVar7,local_198,0);
  (**(code **)(*local_10 + 0x20))(local_158,local_10,local_198);
  uVar8 = CEAngle::Deg();
  printf("    Declination    : %+f degrees\n",uVar8);
  CEAngle::~CEAngle(local_158);
  CEDate::~CEDate(local_198);
  printf("CIRS Coordinates (input)\n");
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_30,0);
  dVar1 = *pvVar6;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_30,1);
  dVar2 = *pvVar6;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_30,2);
  dVar3 = *pvVar6;
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_30,3);
  plVar5 = local_8;
  dVar4 = *pvVar6;
  pCVar7 = (CEDate *)CppEphem::julian_date_J2000();
  CEDate::CEDate(pCVar7,local_1e8,0);
  (**(code **)(*plVar5 + 0x18))(local_1a8,plVar5,local_1e8);
  this = (vector<double,_std::allocator<double>_> *)CEAngle::Deg();
  printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",dVar3 + dVar4,this,
         (ulong)(uint)(int)dVar1,(ulong)(uint)(int)dVar2);
  CEAngle::~CEAngle(local_1a8);
  CEDate::~CEDate(local_1e8);
  pCVar7 = (CEDate *)CppEphem::julian_date_J2000();
  CEDate::CEDate(pCVar7,local_238,0);
  (**(code **)(*local_8 + 0x20))(local_1f8,local_8,local_238);
  uVar8 = CEAngle::Deg();
  printf("    Declination    : %+f degrees\n",uVar8);
  CEAngle::~CEAngle(local_1f8);
  CEDate::~CEDate(local_238);
  printf("\n");
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  return;
}

Assistant:

void PrintResults(const  CESkyCoord& input,
                  const  CESkyCoord& output,
                  double jd)
{
    std::vector<double> input_hms = input.XCoord().HmsVect();
    std::vector<double> output_hms = output.XCoord().HmsVect();
    
    std::printf("\n") ;
    std::printf("**********************************************\n") ;
    std::printf("* Results of CIRS -> ICRS                    *\n") ;
    std::printf("**********************************************\n") ;
    std::printf("ICRS Coordinates (output)\n") ;
    std::printf("    Julian Date    : %f\n", jd) ;
    std::printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",
                int(output_hms[0]), int(output_hms[1]), output_hms[2]+output_hms[3],
                output.XCoord().Deg()) ;
    std::printf("    Declination    : %+f degrees\n", output.YCoord().Deg()) ;
    std::printf("CIRS Coordinates (input)\n") ;
    std::printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",
                int(input_hms[0]), int(input_hms[1]), input_hms[2]+input_hms[3],
                input.XCoord().Deg()) ;
    std::printf("    Declination    : %+f degrees\n", input.YCoord().Deg()) ;
    std::printf("\n") ;
}